

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  long in_RDI;
  ImGuiTableColumn *column;
  int column_n;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x6c); local_c = local_c + 1) {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),local_c);
    if (((pIVar1->IsEnabled & 1U) != 0) || ((pIVar1->Flags & 4U) != 0)) {
      pIVar1->CannotSkipItemsQueue = '\x01';
      pIVar1->AutoFitQueue = '\x02';
    }
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable* table)
{
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_WidthStretch)) // Cannot reset weight of hidden stretch column
            continue;
        column->CannotSkipItemsQueue = (1 << 0);
        column->AutoFitQueue = (1 << 1);
    }
}